

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigSelectBestPat(Ivy_FraigMan_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint i;
  
  uVar6 = 0xffffffffffffffff;
  iVar4 = 0;
  for (uVar3 = 1; (long)uVar3 < (long)p->nSimWords * 0x20; uVar3 = uVar3 + 1) {
    iVar1 = p->pPatScores[uVar3];
    iVar5 = iVar4;
    if (iVar4 <= iVar1) {
      iVar5 = iVar1;
    }
    if (iVar4 < iVar1) {
      uVar6 = uVar3;
    }
    uVar6 = uVar6 & 0xffffffff;
    iVar4 = iVar5;
  }
  if (iVar4 != 0) {
    memset(p->pPatWords,0,(long)p->nPatWords << 2);
    for (i = 0; p_00 = p->pManAig->vPis, (int)i < p_00->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p_00,i);
      if ((*(uint *)(*(long *)((long)pvVar2 + 0x20) + 0x20 + (long)((int)uVar6 >> 5) * 4) &
          1 << ((byte)uVar6 & 0x1f)) != 0) {
        p->pPatWords[i >> 5] = p->pPatWords[i >> 5] | 1 << ((byte)i & 0x1f);
      }
    }
  }
  return iVar4;
}

Assistant:

int Ivy_FraigSelectBestPat( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, nLimit = p->nSimWords * 32, MaxScore = 0, BestPat = -1;
    for ( i = 1; i < nLimit; i++ )
    {
        if ( MaxScore < p->pPatScores[i] )
        {
            MaxScore = p->pPatScores[i];
            BestPat = i;
        }
    }
    if ( MaxScore == 0 )
        return 0;
//    if ( MaxScore > p->pParams->MaxScore )
//    printf( "Max score is %3d.  ", MaxScore );
    // copy the best pattern into the selected pattern
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pSims = Ivy_ObjSim(pObj);
        if ( Ivy_InfoHasBit(pSims->pData, BestPat) )
            Ivy_InfoSetBit(p->pPatWords, i);
    }
    return MaxScore;
}